

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>
               (GetterXsYs<int> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImPlotPlot *pIVar2;
  ImPlotContext *pIVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ImPlotContext *gp;
  float fVar7;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar3 = GImPlot;
  pIVar2 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar2->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar5 = getter->Count;
    local_48 = iVar5 + -1;
    local_40 = line_weight * 0.5;
    lVar4 = (long)((getter->Offset % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
    iVar5 = transformer->YAxis;
    local_3c.x = (float)(((double)*(int *)((long)getter->Xs + lVar4) - (pIVar2->XAxis).Range.Min) *
                         GImPlot->Mx + (double)GImPlot->PixelRange[iVar5].Min.x);
    local_3c.y = (float)(((double)*(int *)((long)getter->Ys + lVar4) -
                         pIVar2->YAxis[iVar5].Range.Min) * GImPlot->My[iVar5] +
                        (double)GImPlot->PixelRange[iVar5].Min.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>>
              ((StairsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin> *)local_58,
               DrawList,&pIVar2->PlotRect);
  }
  else {
    iVar5 = getter->Count;
    lVar4 = (long)((getter->Offset % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
    iVar5 = transformer->YAxis;
    local_58._0_4_ =
         (undefined4)
         (((double)*(int *)((long)getter->Xs + lVar4) - (pIVar2->XAxis).Range.Min) * GImPlot->Mx +
         (double)GImPlot->PixelRange[iVar5].Min.x);
    local_58._4_4_ =
         (undefined4)
         (((double)*(int *)((long)getter->Ys + lVar4) - pIVar2->YAxis[iVar5].Range.Min) *
          GImPlot->My[iVar5] + (double)GImPlot->PixelRange[iVar5].Min.y);
    iVar5 = getter->Count;
    if (1 < iVar5) {
      iVar6 = 1;
      do {
        lVar4 = (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
        iVar5 = transformer->YAxis;
        local_68.x = (float)(((double)*(int *)((long)getter->Xs + lVar4) -
                             (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[iVar5].Min.x);
        local_70.y = (float)(((double)*(int *)((long)getter->Ys + lVar4) -
                             GImPlot->CurrentPlot->YAxis[iVar5].Range.Min) * GImPlot->My[iVar5] +
                            (double)GImPlot->PixelRange[iVar5].Min.y);
        pIVar2 = pIVar3->CurrentPlot;
        fVar7 = (float)local_58._4_4_;
        if (local_70.y <= (float)local_58._4_4_) {
          fVar7 = local_70.y;
        }
        local_70.x = local_68.x;
        if ((fVar7 < (pIVar2->PlotRect).Max.y) &&
           (fVar7 = (float)(~-(uint)(local_70.y <= (float)local_58._4_4_) & (uint)local_70.y |
                           -(uint)(local_70.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar2->PlotRect).Min.y, *pfVar1 <= fVar7 && fVar7 != *pfVar1)) {
          fVar7 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar7 = local_68.x;
          }
          if ((fVar7 < (pIVar2->PlotRect).Max.x) &&
             (fVar7 = (float)(~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x |
                             local_58._0_4_ & -(uint)(local_68.x <= (float)local_58._0_4_)),
             (pIVar2->PlotRect).Min.x <= fVar7 && fVar7 != (pIVar2->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_68,col,line_weight);
            ImDrawList::AddLine(DrawList,&local_68,&local_70,col,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}